

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed64CasesWithSizes_ReadLittleEndian64_Test::TestBody
          (Fixed64CasesWithSizes_ReadLittleEndian64_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  uint64_t value;
  CodedInputStream coded_input;
  Fixed64Case kFixed64Cases_case;
  ArrayInputStream input;
  AssertHelper local_e0;
  AssertHelper local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  AssertHelper local_a8;
  unsigned_long local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  ArrayInputStream *local_88;
  undefined7 local_80;
  undefined1 uStack_79;
  undefined7 uStack_78;
  undefined8 local_70;
  int local_68;
  int local_64;
  int local_60;
  DescriptorPool *local_58;
  MessageFactory *pMStack_50;
  undefined8 local_48;
  uint64_t auStack_40 [2];
  ArrayInputStream local_30;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
           ::GetParam();
  local_48 = *(undefined8 *)
              (pPVar2->
              super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>)
              .
              super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_false>
              ._M_head_impl.bytes;
  auStack_40[0] =
       (pPVar2->
       super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>).
       super__Head_base<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_false>.
       _M_head_impl.value;
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>_>
           ::GetParam();
  _buffer_ = local_48;
  ArrayInputStream::ArrayInputStream
            (&local_30,&io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,
             (pPVar2->
             super__Tuple_impl<0UL,_google::protobuf::io::(anonymous_namespace)::Fixed64Case,_int>).
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_98 = (undefined1  [8])0x0;
  pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80 = 0;
  uStack_79 = 0;
  uStack_78._0_4_ = 0;
  uStack_78._4_1_ = false;
  uStack_78._5_1_ = false;
  uStack_78._6_1_ = false;
  local_70._0_4_ = 0x7fffffff;
  local_70._4_4_ = 0;
  local_68 = 0x7fffffff;
  local_64 = CodedInputStream::default_recursion_limit_;
  local_60 = CodedInputStream::default_recursion_limit_;
  local_58 = (DescriptorPool *)0x0;
  pMStack_50 = (MessageFactory *)0x0;
  local_88 = &local_30;
  CodedInputStream::Refresh((CodedInputStream *)local_98);
  if ((int)pbStack_90 - local_98._0_4_ < 8) {
    bVar1 = CodedInputStream::ReadLittleEndian64Fallback((CodedInputStream *)local_98,&local_a0);
  }
  else {
    local_a0 = *(unsigned_long *)local_98;
    local_98 = (undefined1  [8])((long)local_98 + 8);
    bVar1 = true;
  }
  local_d8.data_._0_1_ = bVar1;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1 == false) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_d8,
               (AssertionResult *)"coded_input.ReadLittleEndian64(&value)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x26e,(char *)local_c8);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if (local_c8 != (undefined1  [8])&local_b8) {
      operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
    }
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"kFixed64Cases_case.value","value",auStack_40,&local_a0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x26f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_d8.data_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_98);
  local_c8 = (undefined1  [8])&DAT_00000008;
  local_d8.data_ = (AssertHelperData *)ArrayInputStream::ByteCount(&local_30);
  testing::internal::CmpHelperEQ<unsigned_long,long>
            ((internal *)local_98,"sizeof(uint64_t)","input.ByteCount()",(unsigned_long *)local_c8,
             (long *)&local_d8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (pbStack_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar3 = (pbStack_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x272,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (pbStack_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_90,pbStack_90);
  }
  return;
}

Assistant:

TEST_P(Fixed64CasesWithSizes, ReadLittleEndian64) {
  Fixed64Case kFixed64Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed64Cases_case.bytes, sizeof(kFixed64Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint64_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian64(&value));
    EXPECT_EQ(kFixed64Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint64_t), input.ByteCount());
}